

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionSystemBullet.cpp
# Opt level: O2

void __thiscall
chrono::collision::ChCollisionSystemBullet::ChCollisionSystemBullet(ChCollisionSystemBullet *this)

{
  int iVar1;
  cbtDefaultCollisionConfiguration *this_00;
  cbtCollisionDispatcher *pcVar2;
  cbtDbvtBroadphase *this_01;
  cbtCollisionWorld *this_02;
  cbtCollisionAlgorithmCreateFunc *pcVar3;
  cbtCollisionAlgorithmCreateFunc *pcVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  cbtDefaultCollisionConstructionInfo local_48;
  
  (this->super_ChCollisionSystem).narrow_callback.
  super___shared_ptr<chrono::collision::ChCollisionSystem::NarrowphaseCallback,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->super_ChCollisionSystem).narrow_callback.
  super___shared_ptr<chrono::collision::ChCollisionSystem::NarrowphaseCallback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChCollisionSystem).vis_callback.
  super___shared_ptr<chrono::collision::ChCollisionSystem::VisualizationCallback,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->super_ChCollisionSystem).vis_callback.
  super___shared_ptr<chrono::collision::ChCollisionSystem::VisualizationCallback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChCollisionSystem).m_system = (ChSystem *)0x0;
  (this->super_ChCollisionSystem).broad_callback.
  super___shared_ptr<chrono::collision::ChCollisionSystem::BroadphaseCallback,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->super_ChCollisionSystem).broad_callback.
  super___shared_ptr<chrono::collision::ChCollisionSystem::BroadphaseCallback,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ChCollisionSystem).narrow_callback.
  super___shared_ptr<chrono::collision::ChCollisionSystem::NarrowphaseCallback,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->super_ChCollisionSystem)._vptr_ChCollisionSystem =
       (_func_int **)&PTR__ChCollisionSystemBullet_01188ad8;
  this->m_debug_drawer = (cbtIDebugDraw *)0x0;
  this_00 = (cbtDefaultCollisionConfiguration *)::operator_new(0xb0);
  local_48.m_persistentManifoldPool = (cbtPoolAllocator *)0x0;
  local_48.m_collisionAlgorithmPool = (cbtPoolAllocator *)0x0;
  local_48.m_defaultMaxPersistentManifoldPoolSize = 0x1000;
  local_48.m_defaultMaxCollisionAlgorithmPoolSize = 0x1000;
  local_48.m_customCollisionAlgorithmMaxElementSize = 0;
  local_48.m_useEpaPenetrationAlgorithm = 1;
  cbtDefaultCollisionConfiguration::cbtDefaultCollisionConfiguration(this_00,&local_48);
  this->bt_collision_configuration = (cbtCollisionConfiguration *)this_00;
  pcVar2 = (cbtCollisionDispatcher *)::operator_new(0x6ec8);
  cbtCollisionDispatcher::cbtCollisionDispatcher(pcVar2,(cbtCollisionConfiguration *)this_00);
  this->bt_dispatcher = pcVar2;
  this_01 = (cbtDbvtBroadphase *)::operator_new(0x100);
  cbtDbvtBroadphase::cbtDbvtBroadphase(this_01,(cbtOverlappingPairCache *)0x0);
  this->bt_broadphase = (cbtBroadphaseInterface *)this_01;
  this_02 = (cbtCollisionWorld *)::operator_new(0xb0);
  cbtCollisionWorld::cbtCollisionWorld
            (this_02,&this->bt_dispatcher->super_cbtDispatcher,(cbtBroadphaseInterface *)this_01,
             this->bt_collision_configuration);
  this->bt_collision_world = this_02;
  pcVar3 = (cbtCollisionAlgorithmCreateFunc *)::operator_new(0x10);
  pcVar3->m_swapped = false;
  pcVar3->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_011888d0;
  this->m_collision_capsule_box = pcVar3;
  pcVar4 = (cbtCollisionAlgorithmCreateFunc *)::operator_new(0x10);
  pcVar4->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_011888d0;
  this->m_collision_box_capsule = pcVar4;
  pcVar4->m_swapped = true;
  cbtCollisionDispatcher::registerCollisionCreateFunc(this->bt_dispatcher,10,0,pcVar3);
  cbtCollisionDispatcher::registerCollisionCreateFunc
            (this->bt_dispatcher,0,10,this->m_collision_box_capsule);
  pcVar3 = (cbtCollisionAlgorithmCreateFunc *)::operator_new(0x10);
  pcVar3->m_swapped = false;
  pcVar3->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_01188928;
  this->m_collision_cylshell_box = pcVar3;
  pcVar4 = (cbtCollisionAlgorithmCreateFunc *)::operator_new(0x10);
  pcVar4->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_01188928;
  this->m_collision_box_cylshell = pcVar4;
  pcVar4->m_swapped = true;
  cbtCollisionDispatcher::registerCollisionCreateFunc(this->bt_dispatcher,0x14,0,pcVar3);
  cbtCollisionDispatcher::registerCollisionCreateFunc
            (this->bt_dispatcher,0,0x14,this->m_collision_box_cylshell);
  pcVar3 = (cbtCollisionAlgorithmCreateFunc *)::operator_new(0x10);
  pcVar3->m_swapped = false;
  pcVar3->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_011889d8;
  this->m_collision_arc_seg = pcVar3;
  pcVar4 = (cbtCollisionAlgorithmCreateFunc *)::operator_new(0x10);
  pcVar4->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_011889d8;
  this->m_collision_seg_arc = pcVar4;
  pcVar4->m_swapped = true;
  cbtCollisionDispatcher::registerCollisionCreateFunc(this->bt_dispatcher,0x1d,0x1e,pcVar3);
  cbtCollisionDispatcher::registerCollisionCreateFunc
            (this->bt_dispatcher,0x1e,0x1d,this->m_collision_seg_arc);
  pcVar3 = (cbtCollisionAlgorithmCreateFunc *)::operator_new(0x10);
  pcVar3->m_swapped = false;
  pcVar3->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_01188a30;
  this->m_collision_arc_arc = pcVar3;
  cbtCollisionDispatcher::registerCollisionCreateFunc(this->bt_dispatcher,0x1d,0x1d,pcVar3);
  pcVar3 = (cbtCollisionAlgorithmCreateFunc *)::operator_new(0x10);
  pcVar3->m_swapped = false;
  pcVar3->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_01188a88;
  this->m_collision_cetri_cetri = pcVar3;
  cbtCollisionDispatcher::registerCollisionCreateFunc(this->bt_dispatcher,0x17,0x17,pcVar3);
  pcVar3 = (cbtCollisionAlgorithmCreateFunc *)cbtAlignedAllocInternal(0x10,0x10);
  this->m_tmp_mem = pcVar3;
  pcVar3->m_swapped = false;
  pcVar3->_vptr_cbtCollisionAlgorithmCreateFunc =
       (_func_int **)&PTR__cbtCollisionAlgorithmCreateFunc_01188c70;
  this->m_emptyCreateFunc = pcVar3;
  cbtCollisionDispatcher::registerCollisionCreateFunc(this->bt_dispatcher,0x16,0x16,pcVar3);
  pcVar2 = this->bt_dispatcher;
  iVar1 = (*this->bt_collision_configuration->_vptr_cbtCollisionConfiguration[4])
                    (this->bt_collision_configuration,8,0);
  cbtCollisionDispatcher::registerCollisionCreateFunc
            (pcVar2,0x16,0,(cbtCollisionAlgorithmCreateFunc *)CONCAT44(extraout_var,iVar1));
  pcVar2 = this->bt_dispatcher;
  iVar1 = (*this->bt_collision_configuration->_vptr_cbtCollisionConfiguration[4])
                    (this->bt_collision_configuration,0,8);
  cbtCollisionDispatcher::registerCollisionCreateFunc
            (pcVar2,0,0x16,(cbtCollisionAlgorithmCreateFunc *)CONCAT44(extraout_var_00,iVar1));
  cbtGImpactCollisionAlgorithm::registerAlgorithm(this->bt_dispatcher);
  return;
}

Assistant:

ChCollisionSystemBullet::ChCollisionSystemBullet() : m_debug_drawer(nullptr) {
    // cbtDefaultCollisionConstructionInfo conf_info(...); ***TODO***
    bt_collision_configuration = new cbtDefaultCollisionConfiguration();

#ifdef BT_USE_OPENMP
    bt_dispatcher = new cbtCollisionDispatcherMt(bt_collision_configuration);  // parallel version
    cbtSetTaskScheduler(cbtGetOpenMPTaskScheduler());
#else
    bt_dispatcher = new cbtCollisionDispatcher(bt_collision_configuration);  // serial version
#endif

    bt_broadphase = new cbtDbvtBroadphase();
    bt_collision_world = new cbtCollisionWorld(bt_dispatcher, bt_broadphase, bt_collision_configuration);

    // custom collision for cylinder-sphere case, for improved precision
    ////cbtCollisionAlgorithmCreateFunc* m_collision_sph_cyl = new cbtSphereCylinderCollisionAlgorithm::CreateFunc;
    ////cbtCollisionAlgorithmCreateFunc* m_collision_cyl_sph = new cbtSphereCylinderCollisionAlgorithm::CreateFunc;
    ////m_collision_cyl_sph->m_swapped = true;
    ////bt_dispatcher->registerCollisionCreateFunc(SPHERE_SHAPE_PROXYTYPE, CYLINDER_SHAPE_PROXYTYPE,
    ///m_collision_sph_cyl); /bt_dispatcher->registerCollisionCreateFunc(CYLINDER_SHAPE_PROXYTYPE,
    ///SPHERE_SHAPE_PROXYTYPE, m_collision_cyl_sph);

    // custom collision for capsule-box case
    m_collision_capsule_box = new cbtCapsuleBoxCollisionAlgorithm::CreateFunc;
    m_collision_box_capsule = new cbtCapsuleBoxCollisionAlgorithm::CreateFunc;
    m_collision_box_capsule->m_swapped = true;
    bt_dispatcher->registerCollisionCreateFunc(CAPSULE_SHAPE_PROXYTYPE, BOX_SHAPE_PROXYTYPE, m_collision_capsule_box);
    bt_dispatcher->registerCollisionCreateFunc(BOX_SHAPE_PROXYTYPE, CAPSULE_SHAPE_PROXYTYPE, m_collision_box_capsule);

    // custom collision for cylshell-box case
    m_collision_cylshell_box = new cbtCylshellBoxCollisionAlgorithm::CreateFunc;
    m_collision_box_cylshell = new cbtCylshellBoxCollisionAlgorithm::CreateFunc;
    m_collision_box_cylshell->m_swapped = true;
    bt_dispatcher->registerCollisionCreateFunc(CYLSHELL_SHAPE_PROXYTYPE, BOX_SHAPE_PROXYTYPE, m_collision_cylshell_box);
    bt_dispatcher->registerCollisionCreateFunc(BOX_SHAPE_PROXYTYPE, CYLSHELL_SHAPE_PROXYTYPE, m_collision_box_cylshell);

    // custom collision for 2D arc-segment case
    m_collision_arc_seg = new cbtArcSegmentCollisionAlgorithm::CreateFunc;
    m_collision_seg_arc = new cbtArcSegmentCollisionAlgorithm::CreateFunc;
    m_collision_seg_arc->m_swapped = true;
    bt_dispatcher->registerCollisionCreateFunc(ARC_SHAPE_PROXYTYPE, SEGMENT_SHAPE_PROXYTYPE, m_collision_arc_seg);
    bt_dispatcher->registerCollisionCreateFunc(SEGMENT_SHAPE_PROXYTYPE, ARC_SHAPE_PROXYTYPE, m_collision_seg_arc);

    // custom collision for 2D arc-arc case
    m_collision_arc_arc = new cbtArcArcCollisionAlgorithm::CreateFunc;
    bt_dispatcher->registerCollisionCreateFunc(ARC_SHAPE_PROXYTYPE, ARC_SHAPE_PROXYTYPE, m_collision_arc_arc);

    // custom collision for C::E triangles:
    m_collision_cetri_cetri = new cbtCEtriangleShapeCollisionAlgorithm::CreateFunc;
    bt_dispatcher->registerCollisionCreateFunc(CE_TRIANGLE_SHAPE_PROXYTYPE, CE_TRIANGLE_SHAPE_PROXYTYPE,
                                               m_collision_cetri_cetri);

    // custom collision for point-point case (in point clouds, just never create point-point contacts)
    // cbtCollisionAlgorithmCreateFunc* m_collision_point_point = new cbtPointPointCollisionAlgorithm::CreateFunc;
    m_tmp_mem = cbtAlignedAlloc(sizeof(cbtEmptyAlgorithm::CreateFunc), 16);
    m_emptyCreateFunc = new (m_tmp_mem) cbtEmptyAlgorithm::CreateFunc;
    bt_dispatcher->registerCollisionCreateFunc(POINT_SHAPE_PROXYTYPE, POINT_SHAPE_PROXYTYPE, m_emptyCreateFunc);
    bt_dispatcher->registerCollisionCreateFunc(POINT_SHAPE_PROXYTYPE, BOX_SHAPE_PROXYTYPE,
                                               bt_collision_configuration->getCollisionAlgorithmCreateFunc(
                                                   SPHERE_SHAPE_PROXYTYPE, BOX_SHAPE_PROXYTYPE));  // just for speedup
    bt_dispatcher->registerCollisionCreateFunc(BOX_SHAPE_PROXYTYPE, POINT_SHAPE_PROXYTYPE,
                                               bt_collision_configuration->getCollisionAlgorithmCreateFunc(
                                                   BOX_SHAPE_PROXYTYPE, SPHERE_SHAPE_PROXYTYPE));  // just for speedup

    // custom collision for GIMPACT mesh case too
    cbtGImpactCollisionAlgorithm::registerAlgorithm(bt_dispatcher);
}